

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr_test.cpp
# Opt level: O0

void __thiscall shared_ptr_compare_ptr_Test::TestBody(shared_ptr_compare_ptr_Test *this)

{
  long lVar1;
  bool bVar2;
  Struct *pSVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  Struct *pY;
  shared_ptr_compare_ptr_Test *this_local;
  Message local_4e0;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_30;
  Message local_4c0;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_29;
  Message local_4a0;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_28;
  Message local_480;
  undefined1 local_478 [8];
  AssertionResult gtest_ar_27;
  Message local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_26;
  Struct *pZ;
  shared_ptr<Struct> zPtr;
  Message local_428;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_25;
  Message local_408;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_24;
  Message local_3e8;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_23;
  Message local_3c8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_22;
  Message local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_21;
  Message local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_20;
  Message local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_19;
  Message local_348;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_18;
  Message local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_17;
  Message local_308;
  int local_2fc;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_16;
  Message local_2e0;
  Struct *local_2d8;
  void *local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_15;
  Message local_2b0;
  long local_2a8;
  int local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_14;
  Message local_280;
  bool local_272;
  bool local_271;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_13;
  Message local_258;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_12;
  Message local_230;
  int local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_11;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_10;
  Message local_1e0;
  Struct *local_1d8;
  void *local_1d0;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_9;
  Message local_1b0;
  long local_1a8;
  int local_19c;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_8;
  Message local_180;
  bool local_172;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_7;
  Message local_158;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_6;
  shared_ptr<Struct> yPtr;
  Struct *pX;
  Message local_118;
  int local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_5;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_4;
  Message local_c8;
  Struct *local_c0;
  void *local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  long local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_2;
  Message local_68;
  bool local_5a;
  bool local_59;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  shared_ptr<Struct> xPtr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar3 = (Struct *)operator_new(4);
  Struct::Struct(pSVar3,0x7b);
  shared_ptr<Struct>::shared_ptr((shared_ptr<Struct> *)&gtest_ar.message_,pSVar3);
  local_31 = true;
  testing::internal::EqHelper<false>::Compare<bool,shared_ptr<Struct>>
            ((EqHelper<false> *)local_30,"true","xPtr",&local_31,
             (shared_ptr<Struct> *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(&local_40);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x134,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_59 = true;
  local_5a = shared_ptr<Struct>::unique((shared_ptr<Struct> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_58,"true","xPtr.unique()",&local_59,&local_5a);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar2) {
    testing::Message::Message(&local_68);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x135,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_84 = 1;
  local_90 = shared_ptr<Struct>::use_count((shared_ptr<Struct> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_80,"1","xPtr.use_count()",&local_84,&local_90);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar2) {
    testing::Message::Message(&local_98);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x136,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b8 = (void *)0x0;
  local_c0 = shared_ptr<Struct>::get((shared_ptr<Struct> *)&gtest_ar.message_);
  testing::internal::CmpHelperNE<void*,Struct*>
            ((internal *)local_b0,"(void*)__null","xPtr.get()",&local_b8,&local_c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar2) {
    testing::Message::Message(&local_c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x137,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_e4 = 0x7b;
  pSVar3 = shared_ptr<Struct>::operator->((shared_ptr<Struct> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_e0,"123","xPtr->mVal",&local_e4,&pSVar3->mVal);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar2) {
    testing::Message::Message(&local_f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x138,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_10c = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_108,"1","Struct::_mNbInstances",&local_10c,
             &Struct::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar2) {
    testing::Message::Message(&local_118);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pX,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x139,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pX,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pX);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  yPtr.px = shared_ptr<Struct>::get((shared_ptr<Struct> *)&gtest_ar.message_);
  pSVar3 = (Struct *)operator_new(4);
  Struct::Struct(pSVar3,0xea);
  shared_ptr<Struct>::shared_ptr((shared_ptr<Struct> *)&gtest_ar_6.message_,pSVar3);
  local_149 = true;
  testing::internal::EqHelper<false>::Compare<bool,shared_ptr<Struct>>
            ((EqHelper<false> *)local_148,"true","xPtr",&local_149,
             (shared_ptr<Struct> *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar2) {
    testing::Message::Message(&local_158);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x13f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_171 = true;
  local_172 = shared_ptr<Struct>::unique((shared_ptr<Struct> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_170,"true","xPtr.unique()",&local_171,&local_172);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(&local_180);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x140,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_19c = 1;
  local_1a8 = shared_ptr<Struct>::use_count((shared_ptr<Struct> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_198,"1","xPtr.use_count()",&local_19c,&local_1a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(&local_1b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x141,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1d0 = (void *)0x0;
  local_1d8 = shared_ptr<Struct>::get((shared_ptr<Struct> *)&gtest_ar.message_);
  testing::internal::CmpHelperNE<void*,Struct*>
            ((internal *)local_1c8,"(void*)__null","xPtr.get()",&local_1d0,&local_1d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar2) {
    testing::Message::Message(&local_1e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x142,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_1fc = 0x7b;
  pSVar3 = shared_ptr<Struct>::operator->((shared_ptr<Struct> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_1f8,"123","xPtr->mVal",&local_1fc,&pSVar3->mVal);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar2) {
    testing::Message::Message(&local_208);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x143,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_224 = 2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_220,"2","Struct::_mNbInstances",&local_224,
             &Struct::_mNbInstances);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar2) {
    testing::Message::Message(&local_230);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x144,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  local_249 = true;
  testing::internal::EqHelper<false>::Compare<bool,shared_ptr<Struct>>
            ((EqHelper<false> *)local_248,"true","yPtr",&local_249,
             (shared_ptr<Struct> *)&gtest_ar_6.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar2) {
    testing::Message::Message(&local_258);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x146,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  local_271 = true;
  local_272 = shared_ptr<Struct>::unique((shared_ptr<Struct> *)&gtest_ar_6.message_);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((EqHelper<false> *)local_270,"true","yPtr.unique()",&local_271,&local_272);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar2) {
    testing::Message::Message(&local_280);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x147,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_29c = 1;
  local_2a8 = shared_ptr<Struct>::use_count((shared_ptr<Struct> *)&gtest_ar_6.message_);
  testing::internal::EqHelper<false>::Compare<int,long>
            ((EqHelper<false> *)local_298,"1","yPtr.use_count()",&local_29c,&local_2a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar2) {
    testing::Message::Message(&local_2b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x148,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  local_2d0 = (void *)0x0;
  local_2d8 = shared_ptr<Struct>::get((shared_ptr<Struct> *)&gtest_ar_6.message_);
  testing::internal::CmpHelperNE<void*,Struct*>
            ((internal *)local_2c8,"(void*)__null","yPtr.get()",&local_2d0,&local_2d8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar2) {
    testing::Message::Message(&local_2e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x149,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_2e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  local_2fc = 0xea;
  pSVar3 = shared_ptr<Struct>::operator->((shared_ptr<Struct> *)&gtest_ar_6.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_2f8,"234","yPtr->mVal",&local_2fc,&pSVar3->mVal);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar2) {
    testing::Message::Message(&local_308);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x14a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  pSVar3 = shared_ptr<Struct>::get((shared_ptr<Struct> *)&gtest_ar_6.message_);
  testing::internal::CmpHelperNE<shared_ptr<Struct>,shared_ptr<Struct>>
            ((internal *)local_320,"xPtr","yPtr",(shared_ptr<Struct> *)&gtest_ar.message_,
             (shared_ptr<Struct> *)&gtest_ar_6.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar2) {
    testing::Message::Message(&local_328);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x14d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  if (yPtr.px < pSVar3) {
    testing::internal::CmpHelperLT<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)local_340,"xPtr","yPtr",(shared_ptr<Struct> *)&gtest_ar.message_,
               (shared_ptr<Struct> *)&gtest_ar_6.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
    if (!bVar2) {
      testing::Message::Message(&local_348);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x150,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_348);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
      testing::Message::~Message(&local_348);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
    testing::internal::CmpHelperLE<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)local_360,"xPtr","yPtr",(shared_ptr<Struct> *)&gtest_ar.message_,
               (shared_ptr<Struct> *)&gtest_ar_6.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
    if (!bVar2) {
      testing::Message::Message(&local_368);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x151,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_368);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
      testing::Message::~Message(&local_368);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
    testing::internal::CmpHelperGT<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)local_380,"yPtr","xPtr",(shared_ptr<Struct> *)&gtest_ar_6.message_,
               (shared_ptr<Struct> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
    if (!bVar2) {
      testing::Message::Message(&local_388);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x152,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_388);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
      testing::Message::~Message(&local_388);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
    testing::internal::CmpHelperGE<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)local_3a0,"yPtr","xPtr",(shared_ptr<Struct> *)&gtest_ar_6.message_,
               (shared_ptr<Struct> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
    if (!bVar2) {
      testing::Message::Message(&local_3a8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x153,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_3a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
      testing::Message::~Message(&local_3a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  }
  else {
    testing::internal::CmpHelperGT<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)local_3c0,"xPtr","yPtr",(shared_ptr<Struct> *)&gtest_ar.message_,
               (shared_ptr<Struct> *)&gtest_ar_6.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
    if (!bVar2) {
      testing::Message::Message(&local_3c8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x157,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_3c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
      testing::Message::~Message(&local_3c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
    testing::internal::CmpHelperGE<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)local_3e0,"xPtr","yPtr",(shared_ptr<Struct> *)&gtest_ar.message_,
               (shared_ptr<Struct> *)&gtest_ar_6.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
    if (!bVar2) {
      testing::Message::Message(&local_3e8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x158,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_3e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
      testing::Message::~Message(&local_3e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
    testing::internal::CmpHelperLT<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)local_400,"yPtr","xPtr",(shared_ptr<Struct> *)&gtest_ar_6.message_,
               (shared_ptr<Struct> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
    if (!bVar2) {
      testing::Message::Message(&local_408);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x159,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_408);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
      testing::Message::~Message(&local_408);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
    testing::internal::CmpHelperLE<shared_ptr<Struct>,shared_ptr<Struct>>
              ((internal *)local_420,"yPtr","xPtr",(shared_ptr<Struct> *)&gtest_ar_6.message_,
               (shared_ptr<Struct> *)&gtest_ar.message_);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar2) {
      testing::Message::Message(&local_428);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&zPtr.px,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
                 ,0x15a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&zPtr.px,&local_428);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&zPtr.px);
      testing::Message::~Message(&local_428);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  }
  shared_ptr<Struct>::shared_ptr((shared_ptr<Struct> *)&pZ,(shared_ptr<Struct> *)&gtest_ar.message_)
  ;
  gtest_ar_26.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       shared_ptr<Struct>::get((shared_ptr<Struct> *)&pZ);
  testing::internal::EqHelper<false>::Compare<Struct*,Struct*>
            ((EqHelper<false> *)local_458,"pX","pZ",&yPtr.px,(Struct **)&gtest_ar_26.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar2) {
    testing::Message::Message(&local_460);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x161,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_460);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  testing::internal::EqHelper<false>::Compare<shared_ptr<Struct>,shared_ptr<Struct>>
            ((EqHelper<false> *)local_478,"xPtr","zPtr",(shared_ptr<Struct> *)&gtest_ar.message_,
             (shared_ptr<Struct> *)&pZ);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar2) {
    testing::Message::Message(&local_480);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x162,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_480);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  testing::internal::EqHelper<false>::Compare<shared_ptr<Struct>,shared_ptr<Struct>>
            ((EqHelper<false> *)local_498,"zPtr","xPtr",(shared_ptr<Struct> *)&pZ,
             (shared_ptr<Struct> *)&gtest_ar.message_);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
  if (!bVar2) {
    testing::Message::Message(&local_4a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x163,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
  testing::internal::CmpHelperGE<shared_ptr<Struct>,shared_ptr<Struct>>
            ((internal *)local_4b8,"xPtr","zPtr",(shared_ptr<Struct> *)&gtest_ar.message_,
             (shared_ptr<Struct> *)&pZ);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar2) {
    testing::Message::Message(&local_4c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x164,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  testing::internal::CmpHelperLE<shared_ptr<Struct>,shared_ptr<Struct>>
            ((internal *)local_4d8,"xPtr","zPtr",(shared_ptr<Struct> *)&gtest_ar.message_,
             (shared_ptr<Struct> *)&pZ);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar2) {
    testing::Message::Message(&local_4e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&this_local,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SRombauts[P]shared_ptr/tests/shared_ptr_test.cpp"
               ,0x165,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&this_local,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&this_local);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  shared_ptr<Struct>::~shared_ptr((shared_ptr<Struct> *)&pZ);
  shared_ptr<Struct>::~shared_ptr((shared_ptr<Struct> *)&gtest_ar_6.message_);
  shared_ptr<Struct>::~shared_ptr((shared_ptr<Struct> *)&gtest_ar.message_);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

TEST(shared_ptr, compare_ptr)
{
    // Create a shared_ptr
    shared_ptr<Struct> xPtr(new Struct(123));

    EXPECT_EQ(true, xPtr);
    EXPECT_EQ(true, xPtr.unique());
    EXPECT_EQ(1, xPtr.use_count());
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(1, Struct::_mNbInstances);
    Struct* pX = xPtr.get();

    // Create another shared_ptr
    shared_ptr<Struct> yPtr(new Struct(234));

    EXPECT_EQ(true, xPtr);
    EXPECT_EQ(true, xPtr.unique());
    EXPECT_EQ(1, xPtr.use_count());
    EXPECT_NE((void*)NULL, xPtr.get());
    EXPECT_EQ(123,xPtr->mVal);
    EXPECT_EQ(2, Struct::_mNbInstances);

    EXPECT_EQ(true, yPtr);
    EXPECT_EQ(true, yPtr.unique());
    EXPECT_EQ(1, yPtr.use_count());
    EXPECT_NE((void*)NULL, yPtr.get());
    EXPECT_EQ(234, yPtr->mVal);
    Struct* pY = yPtr.get();

    EXPECT_NE(xPtr, yPtr);
    if (pX < pY)
    {
        EXPECT_LT(xPtr, yPtr);
        EXPECT_LE(xPtr, yPtr);
        EXPECT_GT(yPtr, xPtr);
        EXPECT_GE(yPtr, xPtr);
    }
    else // (pX > pY)
    {
        EXPECT_GT(xPtr, yPtr);
        EXPECT_GE(xPtr, yPtr);
        EXPECT_LT(yPtr, xPtr);
        EXPECT_LE(yPtr, xPtr);
    }

    // Copy a shared_ptr
    shared_ptr<Struct> zPtr = xPtr;
    Struct* pZ = zPtr.get();

    EXPECT_EQ(pX, pZ);
    EXPECT_EQ(xPtr, zPtr);
    EXPECT_EQ(zPtr, xPtr);
    EXPECT_GE(xPtr, zPtr);
    EXPECT_LE(xPtr, zPtr);
}